

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O1

unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *
__thiscall
wallet::ScriptPubKeyMan::GetScriptPubKeys
          (unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
           *__return_storage_ptr__,ScriptPubKeyMan *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 0;
  (__return_storage_ptr__->_M_h).
  super__Hashtable_base<CScript,_CScript,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  .
  super__Hash_code_base<CScript,_CScript,_std::__detail::_Identity,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .super__Hashtable_ebo_helper<1,_SaltedSipHasher,_false>._M_tp.m_k0 = 0;
  (__return_storage_ptr__->_M_h).
  super__Hashtable_base<CScript,_CScript,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  .
  super__Hash_code_base<CScript,_CScript,_std::__detail::_Identity,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .super__Hashtable_ebo_helper<1,_SaltedSipHasher,_false>._M_tp.m_k1 = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  SaltedSipHasher::SaltedSipHasher((SaltedSipHasher *)__return_storage_ptr__);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

virtual std::unordered_set<CScript, SaltedSipHasher> GetScriptPubKeys() const { return {}; }